

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2StartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  xmlDocPtr doc;
  _xmlNode *p_Var1;
  xmlDtdPtr dtd;
  _xmlDtd *p_Var2;
  int iVar3;
  uint uVar4;
  xmlNodePtr pxVar5;
  _xmlNode *attr;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlElementPtr pxVar8;
  xmlAttributePtr pxVar9;
  xmlNsPtr *str2;
  xmlNodePtr pxVar10;
  xmlChar **ppxVar11;
  _xmlAttribute *p_Var12;
  xmlChar *local_a0;
  uint local_94;
  xmlValidCtxtPtr local_90;
  xmlChar *local_88;
  xmlChar **local_80;
  xmlNodePtr local_78;
  xmlNodePtr local_70;
  xmlNsPtr ns;
  
  if (fullname == (xmlChar *)0x0 || ctx == (void *)0x0) {
    return;
  }
  doc = *(xmlDocPtr *)((long)ctx + 0x10);
  if (doc == (xmlDocPtr)0x0) {
    return;
  }
  if (*(int *)((long)ctx + 0x34) != 0) {
    pxVar5 = xmlNewDocNode(doc,(xmlNsPtr)0x0,fullname,(xmlChar *)0x0);
    if (pxVar5 == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      return;
    }
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,pxVar5);
    iVar3 = nodePush((xmlParserCtxtPtr)ctx,pxVar5);
    if (iVar3 < 0) {
      xmlUnlinkNode(pxVar5);
      xmlFreeNode(pxVar5);
      return;
    }
    if (atts == (xmlChar **)0x0) {
      return;
    }
    pxVar7 = *atts;
    if (pxVar7 == (xmlChar *)0x0) {
      return;
    }
    ppxVar11 = atts + 1;
    local_90 = (xmlValidCtxtPtr)((long)ctx + 0xa0);
    do {
      pxVar6 = *ppxVar11;
      attr = (_xmlNode *)
             xmlNewNsProp(*(xmlNodePtr *)((long)ctx + 0x50),(xmlNsPtr)0x0,pxVar7,(xmlChar *)0x0);
      if (attr == (_xmlNode *)0x0) {
LAB_001485fb:
        xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      }
      else {
        if (pxVar6 == (xmlChar *)0x0) {
          iVar3 = htmlIsBooleanAttr(pxVar7);
          if (iVar3 != 0) {
            pxVar6 = xmlStrdup(pxVar7);
            pxVar7 = pxVar6;
            if (pxVar6 == (xmlChar *)0x0) goto LAB_001485fb;
            goto LAB_001485bb;
          }
          pxVar7 = (xmlChar *)0x0;
        }
        else {
          pxVar7 = (xmlChar *)0x0;
LAB_001485bb:
          pxVar5 = xmlNewDocText(*(xmlDoc **)((long)ctx + 0x10),pxVar6);
          attr->children = pxVar5;
          if (pxVar5 == (xmlNodePtr)0x0) {
            xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
          }
          else {
            attr->last = pxVar5;
            pxVar5->parent = attr;
          }
        }
        if (((((*(byte *)((long)ctx + 0x1b0) & 8) == 0) &&
             (p_Var1 = attr->children, p_Var1 != (_xmlNode *)0x0)) &&
            (p_Var1->type == XML_TEXT_NODE)) && (p_Var1->next == (_xmlNode *)0x0)) {
          iVar3 = xmlIsID(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                          (xmlAttrPtr)attr);
          if (iVar3 < 0) {
            xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
          }
          else if (iVar3 != 0) {
            xmlAddID(local_90,*(xmlDocPtr *)((long)ctx + 0x10),attr->children->content,
                     (xmlAttrPtr)attr);
          }
        }
        if (pxVar7 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar7);
        }
      }
      pxVar7 = ppxVar11[1];
      ppxVar11 = ppxVar11 + 2;
      if (pxVar7 == (xmlChar *)0x0) {
        return;
      }
    } while( true );
  }
  if (((*(int *)((long)ctx + 0x9c) != 0) && (doc->extSubset == (_xmlDtd *)0x0)) &&
     ((p_Var2 = doc->intSubset, p_Var2 == (_xmlDtd *)0x0 ||
      (((p_Var2->notations == (void *)0x0 && (p_Var2->elements == (void *)0x0)) &&
       ((p_Var2->attributes == (void *)0x0 && (p_Var2->entities == (void *)0x0)))))))) {
    xmlCtxtErr((xmlParserCtxtPtr)ctx,(xmlNodePtr)0x0,XML_FROM_DTD,XML_ERR_NO_DTD,XML_ERR_ERROR,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"Validation failed: no DTD found !",0,
               0);
    *(undefined8 *)((long)ctx + 0x98) = 0;
  }
  pxVar7 = xmlSplitQName4(fullname,&local_a0);
  if (pxVar7 == (xmlChar *)0x0) {
LAB_00148b16:
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
    return;
  }
  pxVar5 = xmlNewDocNode(*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,pxVar7,(xmlChar *)0x0);
  if (pxVar5 == (xmlNodePtr)0x0) {
    (*xmlFree)(local_a0);
    goto LAB_00148b16;
  }
  *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
  pxVar10 = *(xmlNodePtr *)((long)ctx + 0x50);
  if (pxVar10 == (xmlNodePtr)0x0) {
    pxVar10 = *(xmlNodePtr *)((long)ctx + 0x10);
  }
  xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,pxVar5);
  iVar3 = nodePush((xmlParserCtxtPtr)ctx,pxVar5);
  pxVar6 = local_a0;
  if (iVar3 < 0) {
    xmlUnlinkNode(pxVar5);
    xmlFreeNode(pxVar5);
    goto LAB_00148d67;
  }
  dtd = *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50);
  local_78 = pxVar10;
  local_70 = pxVar5;
  if ((dtd != (xmlDtdPtr)0x0) || (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) {
    pxVar8 = xmlGetDtdQElementDesc(dtd,pxVar7,local_a0);
    local_94 = (uint)CONCAT71((int7)((ulong)pxVar8 >> 8),pxVar8 != (xmlElementPtr)0x0);
    if ((pxVar8 != (xmlElementPtr)0x0) ||
       (pxVar8 = xmlGetDtdQElementDesc
                           (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar7,pxVar6),
       pxVar8 != (xmlElementPtr)0x0)) {
      local_80 = atts + 2;
      local_90 = (xmlValidCtxtPtr)pxVar6;
      do {
        p_Var12 = pxVar8->attributes;
        if (*(int *)(*(long *)((long)ctx + 0x10) + 0x4c) == 1) {
          pxVar6 = local_88;
          if ((*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0) &&
             (local_88 = pxVar7, *(int *)((long)ctx + 0x9c) != 0)) {
            for (; p_Var12 != (xmlAttributePtr)0x0; p_Var12 = p_Var12->nexth) {
              if (((p_Var12->defaultValue != (xmlChar *)0x0) &&
                  (pxVar9 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),
                                               p_Var12->elem,p_Var12->name,p_Var12->prefix),
                  pxVar9 == p_Var12)) &&
                 (pxVar9 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50),
                                              p_Var12->elem,p_Var12->name,p_Var12->prefix),
                 pxVar9 == (xmlAttributePtr)0x0)) {
                if (p_Var12->prefix == (xmlChar *)0x0) {
                  pxVar7 = xmlStrdup(p_Var12->name);
LAB_0014884f:
                  if (pxVar7 != (xmlChar *)0x0) {
                    if (atts != (xmlChar **)0x0) {
                      pxVar6 = *atts;
                      ppxVar11 = local_80;
                      while (pxVar6 != (xmlChar *)0x0) {
                        iVar3 = xmlStrEqual(pxVar6,pxVar7);
                        if (iVar3 != 0) goto LAB_001488c9;
                        pxVar6 = *ppxVar11;
                        ppxVar11 = ppxVar11 + 2;
                      }
                    }
                    xmlCtxtErr((xmlParserCtxtPtr)ctx,(xmlNodePtr)0x0,XML_FROM_DTD,
                               XML_DTD_STANDALONE_DEFAULTED,XML_ERR_ERROR,pxVar7,p_Var12->elem,
                               (xmlChar *)0x0,0,
                               "standalone: attribute %s on %s defaulted from external subset\n",
                               pxVar7,p_Var12->elem);
                    *(undefined4 *)((long)ctx + 0x98) = 0;
LAB_001488c9:
                    (*xmlFree)(pxVar7);
                    pxVar7 = local_88;
                    goto LAB_001488e1;
                  }
                }
                else {
                  pxVar7 = xmlStrdup(p_Var12->prefix);
                  if ((pxVar7 != (xmlChar *)0x0) &&
                     (pxVar7 = xmlStrcat(pxVar7,":"), pxVar7 != (xmlChar *)0x0)) {
                    pxVar7 = xmlStrcat(pxVar7,p_Var12->name);
                    goto LAB_0014884f;
                  }
                }
                xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
                pxVar7 = local_88;
                pxVar6 = local_88;
                break;
              }
LAB_001488e1:
              pxVar6 = local_88;
            }
          }
          local_88 = pxVar6;
          p_Var12 = pxVar8->attributes;
        }
        for (; p_Var12 != (xmlAttributePtr)0x0; p_Var12 = p_Var12->nexth) {
          if (p_Var12->defaultValue != (xmlChar *)0x0) {
            if (p_Var12->prefix == (xmlChar *)0x0) {
LAB_0014891e:
              iVar3 = xmlStrEqual(p_Var12->name,"xmlns");
              if (iVar3 == 0) {
LAB_0014892e:
                if ((*(byte *)((long)ctx + 0x1b0) & 4) == 0) goto LAB_001489ed;
              }
            }
            else {
              iVar3 = xmlStrEqual(p_Var12->prefix,"xmlns");
              if (iVar3 == 0) {
                if (p_Var12->prefix == (xmlChar *)0x0) goto LAB_0014891e;
                goto LAB_0014892e;
              }
            }
            pxVar9 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50),
                                        p_Var12->elem,p_Var12->name,p_Var12->prefix);
            if (pxVar9 == p_Var12 || pxVar9 == (xmlAttributePtr)0x0) {
              str2 = (xmlNsPtr *)xmlBuildQName(p_Var12->name,p_Var12->prefix,(xmlChar *)&ns,0x32);
              if (str2 == (xmlNsPtr *)0x0) {
                xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
                goto LAB_00148b40;
              }
              if (atts != (xmlChar **)0x0) {
                pxVar6 = *atts;
                ppxVar11 = local_80;
                while (pxVar6 != (xmlChar *)0x0) {
                  iVar3 = xmlStrEqual(pxVar6,(xmlChar *)str2);
                  if (iVar3 != 0) goto LAB_001489ca;
                  pxVar6 = *ppxVar11;
                  ppxVar11 = ppxVar11 + 2;
                }
              }
              xmlSAX1Attribute((xmlParserCtxtPtr)ctx,(xmlChar *)str2,p_Var12->defaultValue,
                               (xmlChar *)local_90);
LAB_001489ca:
              if ((str2 != &ns) && (str2 != (xmlNsPtr *)p_Var12->name)) {
                (*xmlFree)(str2);
              }
            }
          }
LAB_001489ed:
        }
        if ((local_94 & 1) == 0) break;
        pxVar8 = xmlGetDtdQElementDesc
                           (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar7,
                            (xmlChar *)local_90);
        local_94 = 0;
      } while (pxVar8 != (xmlElementPtr)0x0);
    }
  }
LAB_00148b40:
  pxVar5 = local_78;
  if (atts != (xmlChar **)0x0) {
    pxVar7 = *atts;
    pxVar6 = atts[1];
    if (pxVar6 != (xmlChar *)0x0 && pxVar7 != (xmlChar *)0x0) {
      ppxVar11 = atts + 3;
      do {
        if ((((*pxVar7 == 'x') && (pxVar7[1] == 'm')) && (pxVar7[2] == 'l')) &&
           ((pxVar7[3] == 'n' && (pxVar7[4] == 's')))) {
          xmlSAX1Attribute((xmlParserCtxtPtr)ctx,pxVar7,pxVar6,local_a0);
        }
        pxVar7 = ppxVar11[-1];
        if (pxVar7 == (xmlChar *)0x0) break;
        pxVar6 = *ppxVar11;
        ppxVar11 = ppxVar11 + 2;
      } while (pxVar6 != (xmlChar *)0x0);
    }
  }
  pxVar10 = local_70;
  iVar3 = xmlSearchNsSafe(local_70,local_a0,&ns);
  if (iVar3 < 0) {
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  }
  if ((pxVar5 != (xmlNodePtr)0x0 && ns == (xmlNsPtr)0x0) &&
     (iVar3 = xmlSearchNsSafe(pxVar5,local_a0,&ns), iVar3 < 0)) {
    xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  }
  if (ns == (xmlNsPtr)0x0 && local_a0 != (xmlChar *)0x0) {
    xmlCtxtErr((xmlParserCtxtPtr)ctx,(xmlNodePtr)0x0,XML_FROM_NAMESPACE,
               XML_NS_ERR_UNDEFINED_NAMESPACE,XML_ERR_WARNING,local_a0,(xmlChar *)0x0,(xmlChar *)0x0
               ,0,"Namespace prefix %s is not defined\n",local_a0,0);
    ns = xmlNewNs(pxVar10,(xmlChar *)0x0,local_a0);
    if (ns == (xmlNsPtr)0x0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      goto LAB_00148c8e;
    }
LAB_00148c93:
    if ((ns->href != (xmlChar *)0x0) && ((*ns->href != '\0' || (ns->prefix != (xmlChar *)0x0)))) {
      xmlSetNs(pxVar10,ns);
    }
  }
  else {
LAB_00148c8e:
    if (ns != (xmlNsPtr)0x0) goto LAB_00148c93;
  }
  if (atts != (xmlChar **)0x0) {
    pxVar7 = *atts;
    pxVar6 = atts[1];
    if (pxVar6 != (xmlChar *)0x0 && pxVar7 != (xmlChar *)0x0) {
      ppxVar11 = atts + 3;
      do {
        if ((((*pxVar7 != 'x') || (pxVar7[1] != 'm')) || (pxVar7[2] != 'l')) ||
           ((pxVar7[3] != 'n' || (pxVar7[4] != 's')))) {
          xmlSAX1Attribute((xmlParserCtxtPtr)ctx,pxVar7,pxVar6,(xmlChar *)0x0);
        }
        pxVar7 = ppxVar11[-1];
        if (pxVar7 == (xmlChar *)0x0) break;
        pxVar6 = *ppxVar11;
        ppxVar11 = ppxVar11 + 2;
      } while (pxVar6 != (xmlChar *)0x0);
    }
  }
  if ((*(int *)((long)ctx + 0x9c) != 0) && ((*(byte *)((long)ctx + 0xd0) & 1) == 0)) {
    iVar3 = xmlValidateDtdFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10)
                               );
    if ((iVar3 < 1) && (*(undefined4 *)((long)ctx + 0x98) = 0, iVar3 < 0)) {
      *(undefined4 *)((long)ctx + 0x18) = 0;
    }
    uVar4 = xmlValidateRoot((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10));
    *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar4;
    *(byte *)((long)ctx + 0xd0) = *(byte *)((long)ctx + 0xd0) | 1;
  }
LAB_00148d67:
  if (local_a0 == (xmlChar *)0x0) {
    return;
  }
  (*xmlFree)(local_a0);
  return;
}

Assistant:

void
xmlSAX2StartElement(void *ctx, const xmlChar *fullname, const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    (void) atts;

    if ((ctxt == NULL) || (fullname == NULL) || (ctxt->myDoc == NULL))
        return;

#ifdef LIBXML_SAX1_ENABLED
    if (!ctxt->html) {
        xmlSAX1StartElement(ctxt, fullname, atts);
        return;
    }
#endif

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        xmlSAX2StartHtmlElement(ctxt, fullname, atts);
        return;
    }
#endif
}